

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::
     ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,_duckdb::MinMaxFixedValue<int>,_duckdb::GreaterThan>
  *this;
  ulong uVar1;
  InvalidInputException *pIVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  TYPE arg_val;
  TYPE_conflict2 val_val;
  data_ptr_t local_158;
  UnifiedVectorFormat n_format;
  UnifiedVectorFormat arg_format;
  UnifiedVectorFormat val_format;
  UnifiedVectorFormat state_format;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&val_format);
  UnifiedVectorFormat::UnifiedVectorFormat(&arg_format);
  UnifiedVectorFormat::UnifiedVectorFormat(&n_format);
  UnifiedVectorFormat::UnifiedVectorFormat(&state_format);
  Vector::ToUnifiedFormat(inputs,count,&val_format);
  Vector::ToUnifiedFormat(inputs + 1,count,&arg_format);
  Vector::ToUnifiedFormat(inputs + 2,count,&n_format);
  Vector::ToUnifiedFormat(state_vector,count,&state_format);
  local_158 = state_format.data;
  uVar5 = 0;
  do {
    if (count == uVar5) {
      UnifiedVectorFormat::~UnifiedVectorFormat(&state_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&n_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&arg_format);
      UnifiedVectorFormat::~UnifiedVectorFormat(&val_format);
      return;
    }
    uVar4 = uVar5;
    if ((arg_format.sel)->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)(arg_format.sel)->sel_vector[uVar5];
    }
    uVar3 = uVar5;
    if ((val_format.sel)->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)(val_format.sel)->sel_vector[uVar5];
    }
    if (((arg_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) ||
        ((arg_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6]
          >> (uVar4 & 0x3f) & 1) != 0)) &&
       ((val_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0 ||
        ((val_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6]
          >> (uVar3 & 0x3f) & 1) != 0)))) {
      uVar1 = uVar5;
      if ((state_format.sel)->sel_vector != (sel_t *)0x0) {
        uVar1 = (ulong)(state_format.sel)->sel_vector[uVar5];
      }
      this = *(ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,_duckdb::MinMaxFixedValue<int>,_duckdb::GreaterThan>
               **)(local_158 + uVar1 * 8);
      if (this->is_initialized == false) {
        uVar1 = uVar5;
        if ((n_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar1 = (ulong)(n_format.sel)->sel_vector[uVar5];
        }
        if (n_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          if ((n_format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) {
            pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&val_val,
                       "Invalid input for arg_min/arg_max: n value cannot be NULL",
                       (allocator *)&arg_val);
            InvalidInputException::InvalidInputException(pIVar2,(string *)&val_val);
            __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
        }
        uVar1 = *(ulong *)(n_format.data + uVar1 * 8);
        if ((long)uVar1 < 1) {
          pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&val_val,"Invalid input for arg_min/arg_max: n value must be > 0",
                     (allocator *)&arg_val);
          InvalidInputException::InvalidInputException(pIVar2,(string *)&val_val);
          __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (999999 < uVar1) {
          pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&val_val,"Invalid input for arg_min/arg_max: n value must be < %d",
                     (allocator *)&arg_val);
          InvalidInputException::InvalidInputException<long>(pIVar2,(string *)&val_val,1000000);
          __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,_duckdb::MinMaxFixedValue<int>,_duckdb::GreaterThan>
        ::Initialize(this,aggr_input->allocator,uVar1);
      }
      arg_val = *(TYPE *)(arg_format.data + uVar4 * 4);
      val_val = *(TYPE_conflict2 *)(val_format.data + uVar3 * 8);
      BinaryAggregateHeap<int,_double,_duckdb::GreaterThan>::Insert
                (&this->heap,aggr_input->allocator,&arg_val,&val_val);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void ArgMinMaxNUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                             idx_t count) {

	auto &val_vector = inputs[0];
	auto &arg_vector = inputs[1];
	auto &n_vector = inputs[2];

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat arg_format;
	UnifiedVectorFormat n_format;
	UnifiedVectorFormat state_format;

	auto val_extra_state = STATE::VAL_TYPE::CreateExtraState(val_vector, count);
	auto arg_extra_state = STATE::ARG_TYPE::CreateExtraState(arg_vector, count);

	STATE::VAL_TYPE::PrepareData(val_vector, count, val_extra_state, val_format);
	STATE::ARG_TYPE::PrepareData(arg_vector, count, arg_extra_state, arg_format);

	n_vector.ToUnifiedFormat(count, n_format);
	state_vector.ToUnifiedFormat(count, state_format);

	auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);

	for (idx_t i = 0; i < count; i++) {
		const auto arg_idx = arg_format.sel->get_index(i);
		const auto val_idx = val_format.sel->get_index(i);
		if (!arg_format.validity.RowIsValid(arg_idx) || !val_format.validity.RowIsValid(val_idx)) {
			continue;
		}
		const auto state_idx = state_format.sel->get_index(i);
		auto &state = *states[state_idx];

		// Initialize the heap if necessary and add the input to the heap
		if (!state.is_initialized) {
			static constexpr int64_t MAX_N = 1000000;
			const auto nidx = n_format.sel->get_index(i);
			if (!n_format.validity.RowIsValid(nidx)) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value cannot be NULL");
			}
			const auto nval = UnifiedVectorFormat::GetData<int64_t>(n_format)[nidx];
			if (nval <= 0) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be > 0");
			}
			if (nval >= MAX_N) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be < %d", MAX_N);
			}
			state.Initialize(aggr_input.allocator, UnsafeNumericCast<idx_t>(nval));
		}

		// Now add the input to the heap
		auto arg_val = STATE::ARG_TYPE::Create(arg_format, arg_idx);
		auto val_val = STATE::VAL_TYPE::Create(val_format, val_idx);

		state.heap.Insert(aggr_input.allocator, arg_val, val_val);
	}
}